

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O2

void __thiscall
helics::UnknownHandleManager::processNonOptionalUnknowns
          (UnknownHandleManager *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
          *cfunc)

{
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1;
  __node_base *p_Var1;
  pair<helics::GlobalHandle,_unsigned_short> __args_2;
  pair<helics::GlobalHandle,_unsigned_short> __args_2_00;
  pair<helics::GlobalHandle,_unsigned_short> __args_2_01;
  pair<helics::GlobalHandle,_unsigned_short> __args_2_02;
  
  p_Var1 = &(this->unknown_publications)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if ((*(uint *)&p_Var1[6]._M_nxt >> 8 & 1) == 0) {
      __args_2._8_4_ = *(uint *)&p_Var1[6]._M_nxt;
      __args_2.first = *(GlobalHandle *)(p_Var1 + 5);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var1 + 1),PUBLICATION,__args_2);
    }
  }
  p_Var1 = &(this->unknown_endpoints)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if ((*(uint *)&p_Var1[6]._M_nxt >> 8 & 1) == 0) {
      __args_2_00._8_4_ = *(uint *)&p_Var1[6]._M_nxt;
      __args_2_00.first = *(GlobalHandle *)(p_Var1 + 5);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var1 + 1),ENDPOINT,__args_2_00);
    }
  }
  p_Var1 = &(this->unknown_inputs)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if ((*(uint *)&p_Var1[6]._M_nxt >> 8 & 1) == 0) {
      __args_2_01._8_4_ = *(uint *)&p_Var1[6]._M_nxt;
      __args_2_01.first = *(GlobalHandle *)(p_Var1 + 5);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var1 + 1),INPUT,__args_2_01);
    }
  }
  p_Var1 = &(this->unknown_filters)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if ((*(uint *)&p_Var1[6]._M_nxt >> 8 & 1) == 0) {
      __args_2_02._8_4_ = *(uint *)&p_Var1[6]._M_nxt;
      __args_2_02.first = *(GlobalHandle *)(p_Var1 + 5);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var1 + 1),FILTER,__args_2_02);
    }
  }
  return;
}

Assistant:

void UnknownHandleManager::processNonOptionalUnknowns(
    const std::function<void(const std::string&, InterfaceType, TargetInfo handle)>& cfunc) const
{
    for (const auto& upub : unknown_publications) {
        if ((upub.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(upub.first, InterfaceType::PUBLICATION, upub.second);
    }
    for (const auto& uept : unknown_endpoints) {
        if ((uept.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(uept.first, InterfaceType::ENDPOINT, uept.second);
    }
    for (const auto& uinp : unknown_inputs) {
        if ((uinp.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(uinp.first, InterfaceType::INPUT, uinp.second);
    }

    for (const auto& ufilt : unknown_filters) {
        if ((ufilt.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second);
    }
}